

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadThings2(MapData *map)

{
  FMapThing *__s;
  short sVar1;
  uint uVar2;
  FileReader *pFVar3;
  ushort uVar4;
  FMapThing *pFVar5;
  Node *pNVar6;
  int j;
  void *pvVar7;
  long lVar8;
  WORD WVar9;
  FDoomEdEntry *pFVar10;
  Node *pNVar11;
  uint amount;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  
  pFVar3 = map->MapLumps[1].Reader;
  if (pFVar3 == (FileReader *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (ulong)(int)pFVar3->Length;
  }
  amount = (uint)(uVar14 / 0x14);
  TArray<FMapThing,_FMapThing>::Resize(&MapThingsConverted,amount);
  pFVar5 = MapThingsConverted.Array;
  pvVar7 = operator_new__(uVar14);
  pFVar3 = map->MapLumps[1].Reader;
  lVar12 = pFVar3->Length;
  map->file = pFVar3;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,pvVar7,(long)(int)lVar12);
  if (0 < (int)amount) {
    piVar13 = pFVar5->args;
    lVar12 = (long)pvVar7 + 0xf;
    uVar14 = 0;
    do {
      __s = pFVar5 + uVar14;
      memset(__s,0,0x90);
      pFVar5[uVar14].thingid = (int)*(short *)((long)pvVar7 + uVar14 * 0x14);
      pFVar5[uVar14].pos.X = (double)(int)*(short *)((long)pvVar7 + uVar14 * 0x14 + 2);
      pFVar5[uVar14].pos.Y = (double)(int)*(short *)((long)pvVar7 + uVar14 * 0x14 + 4);
      pFVar5[uVar14].pos.Z = (double)(int)*(short *)((long)pvVar7 + uVar14 * 0x14 + 6);
      pFVar5[uVar14].angle = *(short *)((long)pvVar7 + uVar14 * 0x14 + 8);
      sVar1 = *(short *)((long)pvVar7 + uVar14 * 0x14 + 10);
      pFVar5[uVar14].EdNum = sVar1;
      pNVar6 = DoomEdMap.Nodes + (DoomEdMap.Size - 1 & (int)sVar1);
      do {
        pNVar11 = pNVar6;
        if ((pNVar11 == (Node *)0x0) || (pNVar11->Next == (Node *)0x1)) {
          pNVar11 = (Node *)0x0;
          break;
        }
        pNVar6 = pNVar11->Next;
      } while ((pNVar11->Pair).Key != (int)sVar1);
      pFVar10 = &(pNVar11->Pair).Value;
      if (pNVar11 == (Node *)0x0) {
        pFVar10 = (FDoomEdEntry *)0x0;
      }
      __s->info = pFVar10;
      __s->flags = (uint)*(ushort *)((long)pvVar7 + uVar14 * 0x14 + 0xc);
      __s->special = (uint)*(byte *)((long)pvVar7 + uVar14 * 0x14 + 0xe);
      lVar8 = 0;
      do {
        piVar13[lVar8] = (uint)*(byte *)(lVar12 + lVar8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      uVar2 = __s->flags;
      sVar1 = (ushort)((uVar2 & 1) != 0) * 3;
      uVar4 = (ushort)uVar2 & 2;
      WVar9 = sVar1 + 0x18 + uVar4 * 2;
      if ((uVar2 & 4) == 0) {
        WVar9 = sVar1 + uVar4 * 2;
      }
      __s->SkillFilter = WVar9;
      __s->ClassFilter = (ushort)(uVar2 >> 5) & 7;
      __s->flags = uVar2 & 0xffffff18;
      if ((level.flags2._2_1_ & 0x80) != 0) {
        __s->flags = uVar2 & 0x718;
      }
      __s->Gravity = 1.0;
      __s->RenderStyle = 0xe;
      __s->FloatbobPhase = -1;
      __s->Alpha = -1.0;
      __s->health = 1;
      uVar14 = uVar14 + 1;
      piVar13 = piVar13 + 0x24;
      lVar12 = lVar12 + 0x14;
    } while (uVar14 != (amount & 0x7fffffff));
  }
  operator_delete__(pvVar7);
  return;
}

Assistant:

void P_LoadThings2 (MapData * map)
{
	int	lumplen = map->Size(ML_THINGS);
	int numthings = lumplen / sizeof(mapthinghexen_t);

	char *mtp;

	MapThingsConverted.Resize(numthings);
	FMapThing *mti = &MapThingsConverted[0];

	mtp = new char[lumplen];
	map->Read(ML_THINGS, mtp);
	mapthinghexen_t *mth = (mapthinghexen_t*)mtp;

	for(int i = 0; i< numthings; i++)
	{
		memset (&mti[i], 0, sizeof(mti[i]));

		mti[i].thingid = LittleShort(mth[i].thingid);
		mti[i].pos.X = LittleShort(mth[i].x);
		mti[i].pos.Y = LittleShort(mth[i].y);
		mti[i].pos.Z = LittleShort(mth[i].z);
		mti[i].angle = LittleShort(mth[i].angle);
		mti[i].EdNum = LittleShort(mth[i].type);
		mti[i].info = DoomEdMap.CheckKey(mti[i].EdNum);
		mti[i].flags = LittleShort(mth[i].flags);
		mti[i].special = mth[i].special;
		for(int j=0;j<5;j++) mti[i].args[j] = mth[i].args[j];
		mti[i].SkillFilter = MakeSkill(mti[i].flags);
		mti[i].ClassFilter = (mti[i].flags & MTF_CLASS_MASK) >> MTF_CLASS_SHIFT;
		mti[i].flags &= ~(MTF_SKILLMASK|MTF_CLASS_MASK);
		if (level.flags2 & LEVEL2_HEXENHACK)
		{
			mti[i].flags &= 0x7ff;	// mask out Strife flags if playing an original Hexen map.
		}

		mti[i].Gravity = 1;
		mti[i].RenderStyle = STYLE_Count;
		mti[i].Alpha = -1;
		mti[i].health = 1;
		mti[i].FloatbobPhase = -1;
	}
	delete[] mtp;
}